

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O2

double __thiscall fasttext::Meter::log(Meter *this,double __x)

{
  unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
  *this_00;
  int *__k;
  uint64_t *puVar1;
  pointer ppVar2;
  pointer piVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  mapped_type *pmVar6;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *in_RDX;
  const_iterator __end1;
  vector<int,_std::allocator<int>_> *in_RSI;
  const_iterator __begin1;
  pointer ppVar7;
  pointer __k_00;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 extraout_var [60];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  real gold;
  real score;
  Predictions *__range1;
  float local_44;
  double local_40;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *local_38;
  
  this->nexamples_ = this->nexamples_ + 1;
  this_00 = &this->labelMetrics_;
  ppVar2 = (in_RDX->
           super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  ppVar7 = (in_RDX->
           super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (in_RSI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = ppVar2;
  auVar4 = vpunpcklqdq_avx(auVar8,auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (in_RSI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = ppVar7;
  auVar8 = vpunpcklqdq_avx(auVar11,auVar12);
  auVar4 = vpsubq_avx(auVar4,auVar8);
  auVar8 = vpsravq_avx512vl(auVar4,_DAT_00146c80);
  auVar4._0_8_ = (this->metrics_).gold;
  auVar4._8_8_ = (this->metrics_).predicted;
  auVar4 = vpaddq_avx(auVar8,auVar4);
  auVar9 = ZEXT1664(auVar4);
  (this->metrics_).gold = auVar4._0_8_;
  (this->metrics_).predicted = auVar4._8_8_;
  local_38 = in_RDX;
  for (; ppVar7 != ppVar2; ppVar7 = ppVar7 + 1) {
    __k = &ppVar7->second;
    pmVar6 = std::__detail::
             _Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,__k);
    pmVar6->predicted = pmVar6->predicted + 1;
    auVar9._0_4_ = expf(ppVar7->first);
    auVar9._4_60_ = extraout_var;
    local_44 = 0.0;
    auVar4 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar9._0_16_);
    auVar9 = ZEXT1664(auVar4);
    local_40 = (double)CONCAT44(local_40._4_4_,auVar4._0_4_);
    bVar5 = utils::contains<int>(in_RSI,__k);
    if (bVar5) {
      pmVar6 = std::__detail::
               _Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,__k);
      pmVar6->predictedGold = pmVar6->predictedGold + 1;
      puVar1 = &(this->metrics_).predictedGold;
      *puVar1 = *puVar1 + 1;
      local_44 = 1.0;
    }
    pmVar6 = std::__detail::
             _Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,__k);
    std::vector<std::pair<float,float>,std::allocator<std::pair<float,float>>>::
    emplace_back<float&,float&>
              ((vector<std::pair<float,float>,std::allocator<std::pair<float,float>>> *)
               &pmVar6->scoreVsTrue,(float *)&local_40,&local_44);
  }
  piVar3 = (in_RSI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (__k_00 = (in_RSI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start; __k_00 != piVar3; __k_00 = __k_00 + 1) {
    pmVar6 = std::__detail::
             _Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,__k_00);
    pmVar6->gold = pmVar6->gold + 1;
    if (this->falseNegativeLabels_ == true) {
      bVar5 = utils::containsSecond<float,int>(local_38,__k_00);
      if (!bVar5) {
        pmVar6 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)this_00,__k_00);
        local_40 = 1.0;
        std::vector<std::pair<float,float>,std::allocator<std::pair<float,float>>>::
        emplace_back<float_const&,double>
                  ((vector<std::pair<float,float>,std::allocator<std::pair<float,float>>> *)
                   &pmVar6->scoreVsTrue,(float *)&falseNegativeScore,&local_40);
      }
    }
  }
  return auVar9._0_8_;
}

Assistant:

void Meter::log(
    const std::vector<int32_t>& labels,
    const Predictions& predictions) {
  nexamples_++;
  metrics_.gold += labels.size();
  metrics_.predicted += predictions.size();

  for (const auto& prediction : predictions) {
    labelMetrics_[prediction.second].predicted++;

    real score = std::min(std::exp(prediction.first), 1.0f);
    real gold = 0.0;
    if (utils::contains(labels, prediction.second)) {
      labelMetrics_[prediction.second].predictedGold++;
      metrics_.predictedGold++;
      gold = 1.0;
    }
    labelMetrics_[prediction.second].scoreVsTrue.emplace_back(score, gold);
  }

  for (const auto& label : labels) {
    labelMetrics_[label].gold++;
    if (falseNegativeLabels_) {
      if (!utils::containsSecond(predictions, label)) {
        labelMetrics_[label].scoreVsTrue.emplace_back(falseNegativeScore, 1.0);
      }
    }
  }
}